

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem.cpp
# Opt level: O2

void __thiscall r_exec::_Mem::inject_async(_Mem *this,View *view)

{
  atomic_int_fast64_t *paVar1;
  _func_int **pp_Var2;
  int iVar3;
  Group *pGVar4;
  ulong uVar5;
  uint64_t ijt;
  EInjectionJob *this_00;
  AsyncInjectionJob *this_01;
  P<r_exec::_ReductionJob> j;
  
  iVar3 = (*((view->super_View).object.object)->_vptr__Object[0xe])();
  if ((char)iVar3 == '\0') {
    pGVar4 = View::get_host(view);
    iVar3 = (*(pGVar4->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.
              super_Code.super__Object._vptr__Object[0xe])(pGVar4);
    if ((char)iVar3 == '\0') {
      uVar5 = (*Now)();
      ijt = r_code::View::get_ijt(&view->super_View);
      if (uVar5 < ijt) {
        pp_Var2 = (view->super_View).object.object[1]._vptr__Object;
        this_00 = (EInjectionJob *)operator_new(0x28);
        if ((long)pp_Var2 < 0) {
          InjectionJob::InjectionJob((InjectionJob *)this_00,view,ijt);
        }
        else {
          EInjectionJob::EInjectionJob(this_00,view,ijt);
        }
        pushTimeJob(this,(TimeJob *)this_00);
        return;
      }
      this_01 = (AsyncInjectionJob *)operator_new(0x20);
      AsyncInjectionJob::AsyncInjectionJob(this_01,view);
      LOCK();
      paVar1 = &(this_01->super__ReductionJob).super__Object.refCount;
      (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + 1;
      UNLOCK();
      j.object = (_Object *)this_01;
      pushReductionJob(this,(_ReductionJob *)this_01);
      core::P<r_exec::_ReductionJob>::~P(&j);
    }
  }
  return;
}

Assistant:

void _Mem::inject_async(View *view)
{
    if (view->object->is_invalidated()) {
        return;
    }

    Group *host = view->get_host();

    if (host->is_invalidated()) {
        return;
    }

    uint64_t now = Now();
    uint64_t ijt = view->get_ijt();

    if (ijt <= now) {
        P<_ReductionJob> j = new AsyncInjectionJob(view);
        pushReductionJob(j);
    } else {
        if (view->object->is_registered()) { // existing object.
            pushTimeJob(new EInjectionJob(view, ijt));
        } else {
            pushTimeJob(new InjectionJob(view, ijt));
        }
    }
}